

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O3

xchar level_difficulty(d_level *dlev)

{
  xchar xVar1;
  
  if (dlev->dnum == dungeon_topology.d_astral_level.dnum) {
    return (char)dungeons[dungeon_topology.d_sanctum_level.dnum].depth_start +
           dungeon_topology.d_sanctum_level.dlevel + '\x0e';
  }
  if ((u.uhave._0_1_ & 1) == 0) {
    return (char)dungeons[dlev->dnum].depth_start + dlev->dlevel + -1;
  }
  xVar1 = deepest_lev_reached('\0');
  return xVar1;
}

Assistant:

xchar level_difficulty(const d_level *dlev)
{
	if (In_endgame(dlev))
		return (xchar)(depth(&sanctum_level) + 15);
	else
		if (u.uhave.amulet)
			return deepest_lev_reached(FALSE);
		else
			return (xchar) depth(dlev);
}